

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::typeuse<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,bool allowNames)

{
  __index_type *__return_storage_ptr___00;
  __index_type *__return_storage_ptr___01;
  Index pos_00;
  bool bVar1;
  Err *pEVar2;
  Ok *pOVar3;
  unsigned_long *puVar4;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Err local_208;
  Err *local_1e8;
  Err *err_2;
  MaybeResult<unsigned_long> _val_2;
  MaybeResult<unsigned_long> resultTypes;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> namedParams;
  string local_110;
  Err local_f0;
  uint local_cc;
  Err local_c8;
  Err *local_a8;
  Err *err;
  undefined1 local_90 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> x;
  optional<wasm::Ok> local_2a;
  Index IStack_28;
  optional<wasm::Ok> type;
  size_t pos;
  bool allowNames_local;
  ParseDeclsCtx *ctx_local;
  
  _IStack_28 = Lexer::getPos(&ctx->in);
  std::optional<wasm::Ok>::optional(&local_2a);
  expected = sv("type",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)local_90,(Result<wasm::Ok> *)__return_storage_ptr___00);
    local_a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_90);
    bVar1 = local_a8 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_c8,local_a8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
      wasm::Err::~Err(&local_c8);
    }
    local_cc = (uint)bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_90);
    if (local_cc == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        pOVar3 = Result<wasm::Ok>::operator*
                           ((Result<wasm::Ok> *)
                            ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::optional<wasm::Ok>::operator=(&local_2a,pOVar3);
        local_cc = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"expected end of type use",
                   (allocator<char> *)
                   ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x27));
        Lexer::err(&local_f0,&ctx->in,&local_110);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
        wasm::Err::~Err(&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x27));
        local_cc = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    if (local_cc != 0) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr___01 =
       (__index_type *)
       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
  params<wasm::WATParser::ParseDeclsCtx>
            ((MaybeResult<wasm::Ok> *)__return_storage_ptr___01,ctx,allowNames);
  MaybeResult<wasm::Ok>::MaybeResult
            ((MaybeResult<wasm::Ok> *)&err_1,(MaybeResult<wasm::Ok> *)__return_storage_ptr___01);
  pEVar2 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
  if (pEVar2 != (Err *)0x0) {
    wasm::Err::Err((Err *)((long)&resultTypes.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                          0x20),pEVar2);
    Result<wasm::Ok>::Result
              (__return_storage_ptr__,
               (Err *)((long)&resultTypes.val.
                              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
    wasm::Err::~Err((Err *)((long)&resultTypes.val.
                                   super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                           0x20));
  }
  local_cc = (uint)(pEVar2 != (Err *)0x0);
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
  if (local_cc == 0) {
    results<wasm::WATParser::ParseDeclsCtx>
              ((MaybeResult<unsigned_long> *)
               ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),ctx);
    MaybeResult<unsigned_long>::MaybeResult
              ((MaybeResult<unsigned_long> *)&err_2,
               (MaybeResult<unsigned_long> *)
               ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
    local_1e8 = MaybeResult<unsigned_long>::getErr((MaybeResult<unsigned_long> *)&err_2);
    bVar1 = local_1e8 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_208,local_1e8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_208);
      wasm::Err::~Err(&local_208);
    }
    local_cc = (uint)bVar1;
    MaybeResult<unsigned_long>::~MaybeResult((MaybeResult<unsigned_long> *)&err_2);
    if (local_cc == 0) {
      pos_00 = IStack_28;
      pOVar3 = MaybeResult<wasm::Ok>::getPtr
                         ((MaybeResult<wasm::Ok> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      puVar4 = MaybeResult<unsigned_long>::getPtr
                         ((MaybeResult<unsigned_long> *)
                          ((long)&_val_2.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                          0x20));
      ParseDeclsCtx::makeTypeUse(__return_storage_ptr__,ctx,pos_00,local_2a,pOVar3,puVar4);
      local_cc = 1;
    }
    MaybeResult<unsigned_long>::~MaybeResult
              ((MaybeResult<unsigned_long> *)
               ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Ok>::~MaybeResult
            ((MaybeResult<wasm::Ok> *)
             ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeUseT> typeuse(Ctx& ctx, bool allowNames) {
  auto pos = ctx.in.getPos();
  std::optional<typename Ctx::HeapTypeT> type;
  if (ctx.in.takeSExprStart("type"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of type use");
    }

    type = *x;
  }

  auto namedParams = params(ctx, allowNames);
  CHECK_ERR(namedParams);

  auto resultTypes = results(ctx);
  CHECK_ERR(resultTypes);

  return ctx.makeTypeUse(pos, type, namedParams.getPtr(), resultTypes.getPtr());
}